

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O1

bool anon_unknown.dwarf_1f7f66::matched(AffixPatternMatcher *affix,UnicodeString *patternString)

{
  short sVar1;
  bool bVar2;
  UBool UVar3;
  int iVar4;
  bool bVar5;
  UnicodeString UStack_58;
  
  if (affix == (AffixPatternMatcher *)0x0) {
    if ((undefined1  [56])((undefined1  [56])patternString->fUnion & (undefined1  [56])0x1) ==
        (undefined1  [56])0x0) {
      bVar2 = false;
      bVar5 = false;
    }
    else {
      bVar5 = true;
      bVar2 = false;
    }
  }
  else {
    icu_63::numparse::impl::AffixPatternMatcher::getPattern(&UStack_58,affix);
    if ((UStack_58.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
      if (-1 < UStack_58.fUnion.fStackFields.fLengthAndFlags) {
        UStack_58.fUnion.fFields.fLength = (int)UStack_58.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      sVar1 = (patternString->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar4 = (patternString->fUnion).fFields.fLength;
      }
      else {
        iVar4 = (int)sVar1 >> 5;
      }
      bVar2 = true;
      bVar5 = false;
      if ((((int)sVar1 & 1U) == 0) && (bVar5 = false, UStack_58.fUnion.fFields.fLength == iVar4)) {
        UVar3 = icu_63::UnicodeString::doEquals
                          (&UStack_58,patternString,UStack_58.fUnion.fFields.fLength);
        bVar5 = UVar3 != '\0';
      }
    }
    else {
      bVar5 = (bool)(*(byte *)&patternString->fUnion & 1);
      bVar2 = true;
    }
  }
  if (bVar2) {
    icu_63::UnicodeString::~UnicodeString(&UStack_58);
  }
  return bVar5;
}

Assistant:

static bool matched(const AffixPatternMatcher* affix, const UnicodeString& patternString) {
    return (affix == nullptr && patternString.isBogus()) ||
           (affix != nullptr && affix->getPattern() == patternString);
}